

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bork.cpp
# Opt level: O2

void read_exp(ifstream *f,string *buf)

{
  undefined8 in_RAX;
  int iVar1;
  char c;
  
  do {
    std::istream::get((char *)f);
    c = (char)((ulong)in_RAX >> 0x38);
    if (c == '(') break;
  } while (*(int *)(f + *(long *)(*(long *)f + -0x18) + 0x20) == 0);
  std::__cxx11::string::push_back((char)buf);
  for (iVar1 = 1; (*(int *)(f + *(long *)(*(long *)f + -0x18) + 0x20) == 0 && (iVar1 != 0));
      iVar1 = (iVar1 - (uint)(c == ')')) + (uint)(c == '(')) {
    std::istream::get((char *)f);
    std::__cxx11::string::push_back((char)buf);
  }
  return;
}

Assistant:

void read_exp(std::ifstream &f, std::string &buf) {

  char c;

  f.get(c);
  while (c!='(' && f.good()) f.get(c);

  buf.push_back(c);
  int stack = 1;

  while (f.good() && stack) {

    f.get(c);
    buf += c;

    if (c==')') stack--;
    if (c=='(') stack++;

  }

}